

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O3

int __thiscall OpenMD::ifstrstream::open(ifstrstream *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int in_EAX;
  undefined3 extraout_var;
  
  if (this->isRead == false) {
    bVar1 = internalOpen(this,__file,__oflag,false);
    in_EAX = CONCAT31(extraout_var,bVar1);
    this->isRead = bVar1;
  }
  return in_EAX;
}

Assistant:

void ifstrstream::open(const char* filename, std::ios_base::openmode mode,
                         bool checkFilename) {
    if (!isRead) {
#if defined(_MSC_VER)
      isRead =
          internalOpen(filename, mode | std::ios_base::binary, checkFilename);
#else
      isRead = internalOpen(filename, mode, checkFilename);
#endif
    }
  }